

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_response.c
# Opt level: O3

void nhr_response_ungzip(nhr_response r)

{
  void *mem;
  size_t decompressed_size;
  size_t local_18;
  
  local_18 = 0;
  if ((r->body != (void *)0x0) && (r->body_len != 0)) {
    mem = (void *)0x1;
    if ((((r->content_encoding & 1) != 0) || (mem = (void *)0x0, (r->content_encoding & 2) != 0)) &&
       ((mem = nhr_gz_decompress(r->body,r->body_len,&local_18,(uchar)mem), mem != (void *)0x0 &&
        (local_18 != 0)))) {
      nhr_free(r->body);
      r->body = mem;
      r->body_len = local_18;
      return;
    }
    nhr_free(mem);
  }
  return;
}

Assistant:

void nhr_response_ungzip(nhr_response r) {
	void * decompressed = NULL;
	size_t decompressed_size = 0;

	if (!r->body || r->body_len <= 0) {
		return;
	}
	
	if (r->content_encoding & NHR_CONTENT_ENCODING_GZIP) {
		decompressed = nhr_gz_decompress(r->body, r->body_len, &decompressed_size, NHR_GZ_METHOD_GZIP);
	} else if (r->content_encoding & NHR_CONTENT_ENCODING_DEFLATE) {
		decompressed = nhr_gz_decompress(r->body, r->body_len, &decompressed_size, NHR_GZ_METHOD_DEFLATE);
	}
	if (decompressed && decompressed_size > 0) {
		nhr_free(r->body);
		r->body = decompressed;
		r->body_len = decompressed_size;
	} else {
		nhr_free(decompressed);
	}
}